

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall
GEO::ParallelDelaunay3d::set_vertices(ParallelDelaunay3d *this,index_t nb_vertices,double *vertices)

{
  int *piVar1;
  index_t *piVar2;
  Delaunay3dThread *pDVar3;
  pointer pdVar4;
  pointer pSVar5;
  Thread *pTVar6;
  Thread *pTVar7;
  pointer piVar8;
  index_t pool_end;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  uint uVar14;
  Stopwatch *pSVar15;
  clock_t cVar16;
  ostream *poVar17;
  Delaunay3dThread *pDVar18;
  pointer puVar19;
  ThreadManager *pTVar20;
  vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>> *pvVar21;
  pointer pSVar22;
  ulong uVar23;
  pointer piVar24;
  uint uVar25;
  long lVar26;
  pointer piVar27;
  uint uVar28;
  ulong uVar29;
  pointer puVar30;
  uint uVar31;
  ulong uVar32;
  int iVar33;
  ParallelDelaunay3d *pPVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  index_t pool_begin;
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  tms end;
  undefined1 local_b8 [32];
  Stopwatch *local_98;
  ParallelDelaunay3d *local_90;
  vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>> *local_88;
  vector<unsigned_int> *local_80;
  vector<int> *local_78;
  double local_70;
  vector<int> *local_68;
  ulong local_60;
  ulong local_58;
  string local_50;
  
  uVar37 = (ulong)nb_vertices;
  if (this->benchmark_mode_ == true) {
    pSVar15 = (Stopwatch *)operator_new(0x50);
    local_b8._0_8_ = local_b8 + 0x10;
    local_98 = pSVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelInternal","");
    Stopwatch::Stopwatch(pSVar15,(string *)local_b8,true);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  else {
    local_98 = (Stopwatch *)0x0;
  }
  local_90 = this;
  if (this->weighted_ == true) {
    std::vector<double,_GEO::Memory::aligned_allocator<double,_64>_>::resize
              (&(this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>,
               uVar37);
    if (nb_vertices != 0) {
      pdVar4 = (this->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
               super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = 0;
      do {
        dVar9 = vertices[(int)uVar23 + 1];
        dVar10 = (vertices + ((int)uVar23 + 1))[1];
        *(double *)((long)pdVar4 + uVar23 * 2) =
             dVar10 * dVar10 +
             vertices[uVar23 & 0xffffffff] * vertices[uVar23 & 0xffffffff] +
             vertices[(int)uVar23 + 3] * vertices[(int)uVar23 + 3] + dVar9 * dVar9;
        uVar23 = uVar23 + 4;
      } while (uVar37 << 2 != uVar23);
    }
  }
  pPVar34 = local_90;
  Delaunay::set_vertices(&local_90->super_Delaunay,nb_vertices,vertices);
  uVar23 = (ulong)(nb_vertices * 7);
  local_68 = &pPVar34->cell_to_v_store_;
  local_b8._0_4_ = 0xffffffff;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::_M_fill_assign
            (&local_68->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(nb_vertices * 0x1c),(value_type_conflict2 *)local_b8);
  local_78 = &pPVar34->cell_to_cell_store_;
  local_b8._0_4_ = 0xffffffff;
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::_M_fill_assign
            (&local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
             (ulong)(nb_vertices * 0x1c),(value_type_conflict2 *)local_b8);
  local_80 = &pPVar34->cell_next_;
  local_b8._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::_M_fill_assign
            (&local_80->
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,uVar23,
             (value_type_conflict1 *)local_b8);
  local_b8[0] = 0xff;
  local_60 = uVar23;
  std::vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>::_M_fill_assign
            (&(pPVar34->cell_thread_).
              super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>,uVar23
             ,local_b8);
  if ((pPVar34->super_Delaunay).do_reorder_ == true) {
    compute_BRIO_order(nb_vertices,(pPVar34->super_Delaunay).vertices_,&pPVar34->reorder_,3,
                       (uint)(byte)(pPVar34->super_Delaunay).super_Counted.field_0xc,0x40,0.125,
                       &pPVar34->levels_);
  }
  else {
    std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::resize
              (&(pPVar34->reorder_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,uVar37
              );
    auVar12 = _DAT_0018d020;
    if (nb_vertices != 0) {
      puVar19 = (pPVar34->reorder_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar26 = uVar37 - 1;
      auVar39._8_4_ = (int)lVar26;
      auVar39._0_8_ = lVar26;
      auVar39._12_4_ = (int)((ulong)lVar26 >> 0x20);
      uVar23 = 0;
      auVar39 = auVar39 ^ _DAT_0018d020;
      auVar40 = _DAT_0018d010;
      do {
        auVar41 = auVar40 ^ auVar12;
        if ((bool)(~(auVar41._4_4_ == auVar39._4_4_ && auVar39._0_4_ < auVar41._0_4_ ||
                    auVar39._4_4_ < auVar41._4_4_) & 1)) {
          puVar19[uVar23] = (uint)uVar23;
        }
        if ((auVar41._12_4_ != auVar39._12_4_ || auVar41._8_4_ <= auVar39._8_4_) &&
            auVar41._12_4_ <= auVar39._12_4_) {
          puVar19[uVar23 + 1] = (uint)uVar23 + 1;
        }
        uVar23 = uVar23 + 2;
        lVar26 = auVar40._8_8_;
        auVar40._0_8_ = auVar40._0_8_ + 2;
        auVar40._8_8_ = lVar26 + 2;
      } while ((uVar37 + 1 & 0xfffffffffffffffe) != uVar23);
    }
  }
  local_70 = 0.0;
  if (pPVar34->benchmark_mode_ == true) {
    cVar16 = times((tms *)local_b8);
    lVar26 = (local_98->W_).start_user_;
    local_b8._0_8_ = (Delaunay3dThread *)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelInternal1","");
    poVar17 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"BRIO sorting:",0xd);
    local_70 = (double)(cVar16 - lVar26) / 100.0;
    poVar17 = std::ostream::_M_insert<double>(local_70);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  uVar14 = 1;
  if (::(anonymous_namespace)::thread_manager_ != 0) {
    uVar14 = ::(anonymous_namespace)::max_threads_;
  }
  uVar37 = 1;
  if (::(anonymous_namespace)::multithreading_enabled_ != '\0') {
    uVar37 = (ulong)uVar14;
  }
  local_58 = (local_60 & 0xffffffff) / uVar37;
  local_88 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
              *)&pPVar34->threads_;
  std::vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>::
  _M_erase_at_end((vector<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                   *)local_88,
                  (pPVar34->threads_).
                  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  iVar35 = (int)uVar37;
  iVar33 = 0;
  pool_begin = 0;
  do {
    pool_end = (int)local_58 + pool_begin;
    if (iVar35 + -1 == iVar33) {
      pool_end = (index_t)local_60;
    }
    pDVar18 = (Delaunay3dThread *)operator_new(0x2f80);
    Delaunay3dThread::Delaunay3dThread(pDVar18,local_90,pool_begin,pool_end);
    piVar1 = &(pDVar18->super_Thread).super_Counted.nb_refs_;
    *piVar1 = *piVar1 + 1;
    local_b8._0_8_ = pDVar18;
    std::vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>::
    emplace_back<GEO::SmartPointer<GEO::Thread>>(local_88,(SmartPointer<GEO::Thread> *)local_b8);
    if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)0x0) {
      piVar1 = (int *)(local_b8._0_8_ + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)local_b8._0_8_ + 8))();
      }
    }
    pPVar34 = local_90;
    iVar33 = iVar33 + 1;
    pool_begin = pool_end;
  } while (iVar35 + (uint)(iVar35 == 0) != iVar33);
  puVar19 = (local_90->levels_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar14 = (int)((ulong)((long)(local_90->levels_).
                               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                               .
                               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar19) >> 2) - 1
  ;
  uVar37 = 1;
  if (1 < uVar14) {
    uVar37 = 1;
    do {
      if (999 < puVar19[uVar37]) goto LAB_0015509f;
      uVar37 = uVar37 + 1;
    } while (uVar14 != uVar37);
    uVar37 = (ulong)uVar14;
  }
LAB_0015509f:
  if (local_90->benchmark_mode_ == true) {
    pDVar18 = (Delaunay3dThread *)(local_b8 + 0x10);
    local_b8._0_8_ = pDVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar17 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Using ",6);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," levels",7);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar18) {
      operator_delete((void *)local_b8._0_8_);
    }
    local_b8._0_8_ = pDVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar17 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Levels 0 - ",0xb);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,": bootstraping with first levels in sequential mode",0x33);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar18) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  pDVar18 = (Delaunay3dThread *)
            ((pPVar34->threads_).
             super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->pointer_;
  Delaunay3dThread::create_first_tetrahedron(pDVar18);
  puVar19 = (pPVar34->levels_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar32 = uVar37 & 0xffffffff;
  uVar14 = puVar19[uVar32];
  pDVar18->work_begin_ = *puVar19;
  pDVar18->work_end_ = uVar14 - 1;
  (*(pDVar18->super_Thread).super_Counted._vptr_Counted[2])(pDVar18);
  puVar19 = (pPVar34->levels_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar23 = uVar32;
  if ((uint)uVar37 <
      (int)((ulong)((long)(pPVar34->levels_).
                          super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                          .
                          super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar19) >> 2) - 1U) {
    do {
      if (pPVar34->benchmark_mode_ == true) {
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
        poVar17 = Logger::out((string *)local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Level ",6);
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," : start",8);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_);
        }
        puVar19 = (local_90->levels_).
                  super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                  super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar34 = local_90;
      }
      uVar14 = puVar19[uVar23];
      uVar28 = puVar19[uVar23 + 1];
      pSVar22 = (pPVar34->threads_).
                super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 = (pPVar34->threads_).
               super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar37 = (long)pSVar5 - (long)pSVar22 >> 3;
      if (pSVar5 != pSVar22) {
        uVar29 = 0;
        uVar25 = uVar14;
        do {
          uVar31 = uVar25 + (int)((ulong)(uVar28 - uVar14) / (uVar37 & 0xffffffff));
          if (uVar37 - 1 == uVar29) {
            uVar31 = uVar28;
          }
          pTVar6 = pSVar22[uVar29].pointer_;
          if ((int)uVar29 != 0 && uVar23 == uVar32) {
            *(undefined8 *)&pTVar6[5].super_Counted.field_0xc = *(undefined8 *)&pDVar18->max_t_;
            uVar11 = *(undefined8 *)&pDVar18->v3_;
            *(undefined8 *)((long)&pTVar6[9].super_Counted._vptr_Counted + 4) =
                 *(undefined8 *)&pDVar18->v1_;
            *(undefined8 *)&pTVar6[9].super_Counted.field_0xc = uVar11;
          }
          *(uint *)&pTVar6[0xd].super_Counted._vptr_Counted = uVar25;
          *(uint *)((long)&pTVar6[0xd].super_Counted._vptr_Counted + 4) = uVar31 - 1;
          uVar29 = uVar29 + 1;
          uVar25 = uVar31;
        } while ((uVar29 & 0xffffffff) < uVar37);
      }
      uVar23 = uVar23 + 1;
      ::(anonymous_namespace)::running_threads_invocations_ =
           ::(anonymous_namespace)::running_threads_invocations_ + 1;
      pTVar20 = SmartPointer<GEO::ThreadManager>::operator->
                          ((SmartPointer<GEO::ThreadManager> *)
                           &::(anonymous_namespace)::thread_manager_);
      (*(pTVar20->super_Counted)._vptr_Counted[2])(pTVar20,local_88);
      ::(anonymous_namespace)::running_threads_invocations_ =
           ::(anonymous_namespace)::running_threads_invocations_ + -1;
      puVar19 = (local_90->levels_).
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar34 = local_90;
    } while (uVar23 < (int)((ulong)((long)(local_90->levels_).
                                          super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                          .
                                          super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar19
                                   ) >> 2) - 1);
  }
  if (pPVar34->benchmark_mode_ == true) {
    pSVar22 = (pPVar34->threads_).
              super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar21 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
               *)0x0;
    if ((pPVar34->threads_).
        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar22) {
      uVar14 = 1;
      uVar37 = 0;
      do {
        pTVar6 = pSVar22[uVar37].pointer_;
        local_b8._0_8_ = local_b8 + 0x10;
        local_88 = pvVar21;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
        poVar17 = Logger::out((string *)local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"thread ",7);
        *(undefined8 *)(&poVar17->field_0x10 + (long)poVar17->_vptr_basic_ostream[-3]) = 3;
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," : ",3);
        *(undefined8 *)(&poVar17->field_0x10 + (long)poVar17->_vptr_basic_ostream[-3]) = 3;
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," rollbacks  ",0xc);
        *(undefined8 *)(&poVar17->field_0x10 + (long)poVar17->_vptr_basic_ostream[-3]) = 3;
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," restarted locate",0x11);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_);
        }
        pvVar21 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
                   *)(ulong)(uint)((int)local_88 + *(int *)&pTVar6[0x11].super_Counted.field_0xc);
        uVar37 = (ulong)uVar14;
        pSVar22 = (local_90->threads_).
                  super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = uVar14 + 1;
      } while (uVar37 < (ulong)((long)(local_90->threads_).
                                      super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22 >>
                               3));
    }
    pDVar3 = (Delaunay3dThread *)(local_b8 + 0x10);
    local_b8._0_8_ = pDVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar17 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"------------------",0x12);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar3) {
      operator_delete((void *)local_b8._0_8_);
    }
    local_b8._0_8_ = pDVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
    poVar17 = Logger::out((string *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"total: ",7);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," rollbacks  ",0xc);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," restarted locate",0x11);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    pPVar34 = local_90;
    if ((Delaunay3dThread *)local_b8._0_8_ != pDVar3) {
      operator_delete((void *)local_b8._0_8_);
      pPVar34 = local_90;
    }
  }
  pSVar22 = (pPVar34->threads_).
            super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar34->threads_).
      super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pSVar22) {
LAB_00155885:
    if (pPVar34->benchmark_mode_ != false) {
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
      poVar17 = Logger::out((string *)local_b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17,"All the points were inserted in parallel mode",0x2d);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
LAB_001558f8:
      if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
  }
  else {
    iVar35 = 0;
    uVar37 = 0;
    uVar23 = 1;
    do {
      pTVar6 = pSVar22[uVar37].pointer_;
      uVar14 = *(uint *)&pTVar6[0xd].super_Counted._vptr_Counted;
      uVar28 = *(uint *)((long)&pTVar6[0xd].super_Counted._vptr_Counted + 4);
      iVar33 = (uVar28 - uVar14) + 1;
      if ((uVar14 & uVar28) == 0xffffffff) {
        iVar33 = 0;
      }
      iVar38 = (int)uVar23;
      if (iVar38 != 1) {
        pTVar7 = pSVar22[iVar38 - 2].pointer_;
        *(undefined8 *)&pTVar6[5].super_Counted.field_0xc =
             *(undefined8 *)&pTVar7[5].super_Counted.field_0xc;
        uVar11 = *(undefined8 *)&pTVar7[9].super_Counted.field_0xc;
        *(undefined8 *)((long)&pTVar6[9].super_Counted._vptr_Counted + 4) =
             *(undefined8 *)((long)&pTVar7[9].super_Counted._vptr_Counted + 4);
        *(undefined8 *)&pTVar6[9].super_Counted.field_0xc = uVar11;
      }
      iVar35 = iVar35 + iVar33;
      (*(pTVar6->super_Counted)._vptr_Counted[2])();
      pSVar22 = (pPVar34->threads_).
                super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar26 = (long)(pPVar34->threads_).
                     super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22;
      bVar13 = uVar23 < (ulong)(lVar26 >> 3);
      uVar37 = uVar23;
      uVar23 = (ulong)(iVar38 + 1);
    } while (bVar13);
    if (iVar35 == 0) goto LAB_00155885;
    pTVar6 = pSVar22->pointer_;
    lVar26 = *(long *)((long)pSVar22 + lVar26 + -8);
    *(undefined8 *)&pTVar6[5].super_Counted.field_0xc = *(undefined8 *)(lVar26 + 0x5c);
    uVar11 = *(undefined8 *)(lVar26 + 0x9c);
    *(undefined8 *)((long)&pTVar6[9].super_Counted._vptr_Counted + 4) =
         *(undefined8 *)(lVar26 + 0x94);
    *(undefined8 *)&pTVar6[9].super_Counted.field_0xc = uVar11;
    if (pPVar34->benchmark_mode_ == true) {
      pDVar3 = (Delaunay3dThread *)(local_b8 + 0x10);
      local_b8._0_8_ = pDVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
      poVar17 = Logger::out((string *)local_b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17,"Local thread memory overflow occurred:",0x26);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      if ((Delaunay3dThread *)local_b8._0_8_ != pDVar3) {
        operator_delete((void *)local_b8._0_8_);
      }
      local_b8._0_8_ = pDVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PDEL","");
      poVar17 = Logger::out((string *)local_b8);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar17," points inserted in sequential mode",0x23);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      goto LAB_001558f8;
    }
  }
  if (pPVar34->benchmark_mode_ == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"DelInternal2","");
    poVar17 = Logger::out(&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Core insertion algo:",0x14);
    cVar16 = times((tms *)local_b8);
    poVar17 = std::ostream::_M_insert<double>
                        ((double)(cVar16 - (local_98->W_).start_user_) / 100.0 - local_70);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
LAB_001559d0:
    Stopwatch::~Stopwatch(local_98);
  }
  else if (local_98 != (Stopwatch *)0x0) goto LAB_001559d0;
  operator_delete(local_98);
  if (pPVar34->debug_mode_ == true) {
    if ((pPVar34->threads_).
        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pPVar34->threads_).
        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar37 = 1;
      do {
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," : ",3);
        pPVar34 = local_90;
        poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        bVar13 = uVar37 < (ulong)((long)(pPVar34->threads_).
                                        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pPVar34->threads_).
                                        super__Vector_base<GEO::SmartPointer<GEO::Thread>,_std::allocator<GEO::SmartPointer<GEO::Thread>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar37 = (ulong)((int)uVar37 + 1);
      } while (bVar13);
    }
    Delaunay3dThread::check_combinatorics(pDVar18,pPVar34->verbose_debug_mode_);
    Delaunay3dThread::check_geometry(pDVar18,pPVar34->verbose_debug_mode_);
  }
  if (pPVar34->benchmark_mode_ == true) {
    pSVar15 = (Stopwatch *)operator_new(0x50);
    local_b8._0_8_ = (Delaunay3dThread *)(local_b8 + 0x10);
    local_98 = pSVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelCompress","");
    Stopwatch::Stopwatch(pSVar15,(string *)local_b8,true);
    if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  if (pDVar18->max_t_ == 0) {
    uVar14 = 0;
    local_88 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
                *)0x0;
  }
  else {
    uVar23 = 0;
    uVar28 = 0;
    uVar37 = 0;
    do {
      if ((((pPVar34->super_Delaunay).keep_infinite_ == true) &&
          ((pDVar18->cell_next_->
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar23] == 0xfffffffe)) ||
         (bVar13 = Delaunay3dThread::tet_is_real(pDVar18,(index_t)uVar23), bVar13)) {
        uVar14 = (uint)uVar37;
        if (uVar23 != uVar37) {
          piVar27 = (local_68->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar25 = (index_t)uVar23 * 4;
          piVar8 = piVar27 + uVar25;
          uVar11 = *(undefined8 *)(piVar8 + 2);
          piVar27 = piVar27 + uVar14 * 4;
          *(undefined8 *)piVar27 = *(undefined8 *)piVar8;
          *(undefined8 *)(piVar27 + 2) = uVar11;
          piVar27 = (local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar8 = piVar27 + uVar25;
          uVar11 = *(undefined8 *)(piVar8 + 2);
          piVar27 = piVar27 + uVar14 * 4;
          *(undefined8 *)piVar27 = *(undefined8 *)piVar8;
          *(undefined8 *)(piVar27 + 2) = uVar11;
        }
        (local_80->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23] = uVar14;
        uVar37 = (ulong)(uVar14 + 1);
      }
      else {
        (local_80->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23] = 0xffffffff;
        uVar28 = uVar28 + 1;
      }
      uVar14 = (uint)uVar37;
      uVar23 = uVar23 + 1;
    } while (uVar23 < pDVar18->max_t_);
    local_88 = (vector<GEO::SmartPointer<GEO::Thread>,std::allocator<GEO::SmartPointer<GEO::Thread>>>
                *)(ulong)uVar28;
  }
  uVar37 = (ulong)(uVar14 * 4);
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
            (&local_68->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,uVar37);
  std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
            (&local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,uVar37);
  if (uVar14 * 4 != 0) {
    piVar8 = (local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar19 = (local_80->
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar23 = 0;
    do {
      piVar8[uVar23] = puVar19[(uint)piVar8[uVar23]];
      uVar23 = uVar23 + 1;
    } while (uVar37 != uVar23);
  }
  if ((pPVar34->super_Delaunay).keep_infinite_ != false) {
    (pPVar34->super_Delaunay).nb_finite_cells_ = 0;
    piVar8 = (pDVar18->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             ).super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar19 = (pPVar34->cell_next_).
              super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
              _M_impl.super__Vector_impl_data._M_start;
    piVar27 = (pPVar34->cell_to_v_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar24 = (pPVar34->cell_to_cell_store_).
              super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
              super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar28 = 0;
    uVar23 = (ulong)uVar14;
    puVar30 = puVar19;
    do {
      uVar32 = (ulong)(uVar28 * 4);
      if (-1 < piVar8[uVar32]) {
        do {
          iVar35 = (int)uVar32;
          if (((piVar8[iVar35 + 1] < 0) || (piVar8[iVar35 + 2] < 0)) || (piVar8[iVar35 + 3] < 0))
          break;
          puVar30[uVar28] = uVar28;
          piVar2 = &(pPVar34->super_Delaunay).nb_finite_cells_;
          *piVar2 = *piVar2 + 1;
          uVar28 = uVar28 + 1;
          uVar32 = (ulong)(iVar35 + 4);
        } while (-1 < piVar8[uVar32]);
        puVar30 = (local_80->
                  super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
                  super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar25 = (uint)uVar23;
      uVar31 = uVar25 * 4;
      while( true ) {
        uVar25 = uVar25 - 1;
        uVar36 = uVar31 - 4;
        uVar23 = (ulong)uVar25;
        if (((-1 < piVar8[uVar36]) && (-1 < piVar8[uVar31 - 3])) &&
           ((-1 < piVar8[uVar31 - 2] && (-1 < piVar8[uVar31 - 1])))) break;
        puVar30[uVar23] = uVar25;
        uVar31 = uVar36;
      }
      if (uVar25 < uVar28) goto LAB_00155e1a;
      puVar19[uVar28] = uVar25;
      puVar19[uVar23] = uVar28;
      piVar2 = &(pPVar34->super_Delaunay).nb_finite_cells_;
      *piVar2 = *piVar2 + 1;
      lVar26 = 0;
      do {
        iVar35 = piVar24[uVar32 + lVar26];
        piVar24[uVar32 + lVar26] = piVar24[(ulong)uVar36 + lVar26];
        piVar24[(ulong)uVar36 + lVar26] = iVar35;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 4);
      lVar26 = 0;
      do {
        iVar35 = piVar27[uVar32 + lVar26];
        piVar27[uVar32 + lVar26] = piVar27[(ulong)uVar36 + lVar26];
        piVar27[(ulong)uVar36 + lVar26] = iVar35;
        lVar26 = lVar26 + 1;
      } while (lVar26 != 4);
      uVar28 = uVar28 + 1;
      puVar30 = (local_80->
                super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
                super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar34 = local_90;
    } while( true );
  }
  if (pPVar34->benchmark_mode_ == false) goto LAB_00155ee6;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelCompress","");
  poVar17 = Logger::out((string *)local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Removed ",8);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," tets (free list and infinite)",0x1e);
  std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
LAB_00155ed7:
  if ((Delaunay3dThread *)local_b8._0_8_ != (Delaunay3dThread *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
LAB_00155ee6:
  if (local_98 != (Stopwatch *)0x0) {
    Stopwatch::~Stopwatch(local_98);
  }
  operator_delete(local_98);
  piVar8 = (pPVar34->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar27 = (pointer)((long)(pPVar34->cell_to_v_store_).
                            super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 & 0x3fffffffc);
  if (piVar27 != (pointer)0x0) {
    piVar27 = piVar8;
  }
  piVar8 = (pPVar34->cell_to_cell_store_).
           super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar24 = (pointer)((long)(pPVar34->cell_to_cell_store_).
                            super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 & 0x3fffffffc);
  if (piVar24 != (pointer)0x0) {
    piVar24 = piVar8;
  }
  (*(pPVar34->super_Delaunay).super_Counted._vptr_Counted[9])(pPVar34,(ulong)uVar14,piVar27,piVar24)
  ;
  return;
LAB_00155e1a:
  if (uVar37 != 0) {
    piVar8 = (local_78->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = 0;
    do {
      piVar8[uVar23] = puVar30[(uint)piVar8[uVar23]];
      uVar23 = uVar23 + 1;
    } while (uVar37 != uVar23);
  }
  if (pPVar34->benchmark_mode_ == false) goto LAB_00155ee6;
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"DelCompress","");
  poVar17 = Logger::out((string *)local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Removed ",8);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," tets (free list)",0x11);
  std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  goto LAB_00155ed7;
}

Assistant:

void ParallelDelaunay3d::set_vertices(
        index_t nb_vertices, const double* vertices
    ) {
        Stopwatch* W = nullptr ;
        if(benchmark_mode_) {
            W = new Stopwatch("DelInternal");
        }

        if(weighted_) {
            heights_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                // Client code uses 4d embedding with ti = sqrt(W - wi)
                //   where W = max(wi)
                // We recompute the standard "shifted" lifting on
                // the paraboloid from it.
                // (we use wi - W, everything is shifted by W, but
                // we do not care since the power diagram is invariant
                // by a translation of all weights).
                double w = -geo_sqr(vertices[4 * i + 3]);
                heights_[i] = -w +
                    geo_sqr(vertices[4 * i]) +
                    geo_sqr(vertices[4 * i + 1]) +
                    geo_sqr(vertices[4 * i + 2]);
            }
        }
        Delaunay::set_vertices(nb_vertices, vertices);

        index_t expected_tetra = nb_vertices * 7;
    
        // Allocate the tetrahedra
        cell_to_v_store_.assign(expected_tetra * 4,-1);
        cell_to_cell_store_.assign(expected_tetra * 4,-1);
        cell_next_.assign(expected_tetra,index_t(-1));
        cell_thread_.assign(expected_tetra,thread_index_t(-1));

        // Reorder the points
        if(do_reorder_) {
            compute_BRIO_order(
                nb_vertices, vertex_ptr(0), reorder_,
		3, dimension(),
                64, 0.125,
                &levels_
            );        
        } else {
            reorder_.resize(nb_vertices);
            for(index_t i = 0; i < nb_vertices; ++i) {
                reorder_[i] = i;
            }
            geo_debug_assert(levels_[0] == 0);
            geo_debug_assert(levels_[levels_.size()-1] == nb_vertices);
        }

        double sorting_time = 0;
        if(benchmark_mode_) {
            sorting_time = W->elapsed_time();
            Logger::out("DelInternal1") << "BRIO sorting:"
                                       << sorting_time
                                       << std::endl;
        } 

        // Create the threads
        index_t nb_threads = Process::maximum_concurrent_threads();
        index_t pool_size = expected_tetra / nb_threads;
        index_t pool_begin = 0;
        threads_.clear();
        for(index_t t=0; t<nb_threads; ++t) {
            index_t pool_end = 
                (t == nb_threads - 1) ? expected_tetra : pool_begin + pool_size;
            threads_.push_back(
                new Delaunay3dThread(this, pool_begin, pool_end)
            );
            pool_begin = pool_end;
        }


        // Create first tetrahedron and triangulate first set of points 
        // in sequential mode.


        index_t lvl = 1;
        while(lvl < (levels_.size() - 1) && levels_[lvl] < 1000) {
            ++lvl;
        }

        if(benchmark_mode_) {
            Logger::out("PDEL")
                << "Using " << levels_.size()-1 << " levels" << std::endl;
            Logger::out("PDEL") 
                << "Levels 0 - " << lvl-1 
                << ": bootstraping with first levels in sequential mode"
                << std::endl;
        }
        Delaunay3dThread* thread0 = 
                    static_cast<Delaunay3dThread*>(threads_[0].get());
        thread0->create_first_tetrahedron();
        thread0->set_work(levels_[0], levels_[lvl]);
        thread0->run();

        index_t first_lvl = lvl;

        // Insert points in all BRIO levels
        for(; lvl<levels_.size()-1; ++lvl) {

            if(benchmark_mode_) {
                Logger::out("PDEL") << "Level " 
                                    << lvl << " : start" << std::endl;
            }

            index_t lvl_b = levels_[lvl];
            index_t lvl_e = levels_[lvl+1];
            index_t work_size = (lvl_e - lvl_b)/index_t(threads_.size());

            // Initialize threads
            index_t b = lvl_b;
            for(index_t t=0; t<threads_.size(); ++t) {
                index_t e = t == threads_.size()-1 ? lvl_e : b+work_size;
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                
                // Copy the indices of the first created tetrahedron
                // and the maximum valid tetrahedron index max_t_
                if(lvl == first_lvl && t!=0) {
                    thread->initialize_from(thread0);
                }
                thread->set_work(b,e);
                b = e;
            }
            Process::run_threads(threads_);
        }


        if(benchmark_mode_) {
            index_t tot_rollbacks = 0 ;
            index_t tot_failed_locate = 0 ;
            for(index_t t=0; t<threads_.size(); ++t) {
                Delaunay3dThread* thread = 
                    static_cast<Delaunay3dThread*>(threads_[t].get());
                Logger::out("PDEL") 
                    << "thread " << std::setw(3) << t << " : " 
                    << std::setw(3) << thread->nb_rollbacks() << " rollbacks  "
                    << std::setw(3) << thread->nb_failed_locate() << " restarted locate"
                    << std::endl;
                tot_rollbacks += thread->nb_rollbacks();
                tot_failed_locate += thread->nb_failed_locate();
            }
            Logger::out("PDEL") << "------------------" << std::endl;
            Logger::out("PDEL") << "total: " 
                                << tot_rollbacks << " rollbacks  "
                                << tot_failed_locate << " restarted locate"
                                << std::endl;
        }

        // Run threads sequentialy, to insert missing points if
        // memory overflow was encountered (in sequential mode,
        // dynamic memory growing works)

        index_t nb_sequential_points = 0;
        for(index_t t=0; t<threads_.size(); ++t) {
            Delaunay3dThread* t1 = 
                static_cast<Delaunay3dThread*>(threads_[t].get());

            nb_sequential_points += t1->work_size();

            if(t != 0) {
                // We need to copy max_t_ from previous thread, 
                // since the memory pool may have grown.
                Delaunay3dThread* t2 = 
                    static_cast<Delaunay3dThread*>(threads_[t-1].get());
                t1->initialize_from(t2);
            }
            t1->run();
        }

        //  If some tetrahedra were created in sequential mode, then
        // the maximum valid tetrahedron index was increased by all
        // the threads in increasing number, so we copy it from the
        // last thread into thread0 since we use thread0 afterwards
        // to do the "compaction" afterwards.
        
        if(nb_sequential_points != 0) {
            Delaunay3dThread* t0 = 
                static_cast<Delaunay3dThread*>(threads_[0].get());
            Delaunay3dThread* tn = 
                static_cast<Delaunay3dThread*>(
                    threads_[threads_.size()-1].get()
                );
            t0->initialize_from(tn);
        }
        

        
        if(benchmark_mode_) {
            if(nb_sequential_points != 0) {
                Logger::out("PDEL") << "Local thread memory overflow occurred:"
                                    << std::endl;
                Logger::out("PDEL") << nb_sequential_points
                                    << " points inserted in sequential mode"
                                    << std::endl;
            } else {
                Logger::out("PDEL") 
                    << "All the points were inserted in parallel mode"
                    << std::endl;
            }
        }

        if(benchmark_mode_) {
            Logger::out("DelInternal2") << "Core insertion algo:"
                                       << W->elapsed_time() - sorting_time
                                       << std::endl;
        }
        delete W;

        if(debug_mode_) {
            for(index_t i=0; i<threads_.size(); ++i) {
                std::cerr << i << " : " <<
                    static_cast<Delaunay3dThread*>(threads_[i].get())
                    ->max_t() << std::endl;
            }
            
            thread0->check_combinatorics(verbose_debug_mode_);
            thread0->check_geometry(verbose_debug_mode_);
        }

        if(benchmark_mode_) {
            W = new Stopwatch("DelCompress");
        }

        //   Compress cell_to_v_store_ and cell_to_cell_store_
        // (remove free and virtual tetrahedra).
        //   Since cell_next_ is not used at this point,
        // we reuse it for storing the conversion array that
        // maps old tet indices to new tet indices
        // Note: tet_is_real() uses the previous value of 
        // cell_next(), but we are processing indices
        // in increasing order and since old2new[t] is always
        // smaller or equal to t, we never overwrite a value
        // before needing it.
        
        vector<index_t>& old2new = cell_next_;
        index_t nb_tets = 0;
        index_t nb_tets_to_delete = 0;

        {
            for(index_t t = 0; t < thread0->max_t(); ++t) {
                if(
                    (keep_infinite_ && !thread0->tet_is_free(t)) ||
                    thread0->tet_is_real(t)
                ) {
                    if(t != nb_tets) {
                        Memory::copy(
                            &cell_to_v_store_[nb_tets * 4],
                            &cell_to_v_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                        Memory::copy(
                            &cell_to_cell_store_[nb_tets * 4],
                            &cell_to_cell_store_[t * 4],
                            4 * sizeof(signed_index_t)
                        );
                    }
                    old2new[t] = nb_tets;
                    ++nb_tets;
                } else {
                    old2new[t] = index_t(-1);
                    ++nb_tets_to_delete;
                }
            }

            cell_to_v_store_.resize(4 * nb_tets);
            cell_to_cell_store_.resize(4 * nb_tets);
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                // Note: t can be equal to -1 when a real tet is
                // adjacent to a virtual one (and this is how the
                // rest of Vorpaline expects to see tets on the
                // border).
                geo_debug_assert(!(keep_infinite_ && t < 0));
                cell_to_cell_store_[i] = t;
            }
        }

        // In "keep_infinite" mode, we reorder the cells in such
        // a way that finite cells have indices [0..nb_finite_cells_-1]
        // and infinite cells have indices [nb_finite_cells_ .. nb_cells_-1]
        
        if(keep_infinite_) {
            nb_finite_cells_ = 0;
            index_t finite_ptr = 0;
            index_t infinite_ptr = nb_tets - 1;
            for(;;) {
                while(thread0->tet_is_finite(finite_ptr)) {
                    old2new[finite_ptr] = finite_ptr;
                    ++finite_ptr;
                    ++nb_finite_cells_;
                }
                while(!thread0->tet_is_finite(infinite_ptr)) {
                    old2new[infinite_ptr] = infinite_ptr;
                    --infinite_ptr;
                }
                if(finite_ptr > infinite_ptr) {
                    break;
                }
                old2new[finite_ptr] = infinite_ptr;
                old2new[infinite_ptr] = finite_ptr;
                ++nb_finite_cells_;
                for(index_t lf=0; lf<4; ++lf) {
                    std::swap(
                        cell_to_cell_store_[4*finite_ptr + lf],
                        cell_to_cell_store_[4*infinite_ptr + lf]
                    );
                }
                for(index_t lv=0; lv<4; ++lv) {
                    std::swap(
                        cell_to_v_store_[4*finite_ptr + lv],
                        cell_to_v_store_[4*infinite_ptr + lv]
                    );
                }
                ++finite_ptr;
                --infinite_ptr;
            }
            for(index_t i = 0; i < 4 * nb_tets; ++i) {
                signed_index_t t = cell_to_cell_store_[i];
                geo_debug_assert(t >= 0);
                t = signed_index_t(old2new[t]);
                geo_debug_assert(t >= 0);
                cell_to_cell_store_[i] = t;
            }
        }
        
        
        if(benchmark_mode_) {
            if(keep_infinite_) {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list)" << std::endl;
            } else {
                Logger::out("DelCompress") 
                    << "Removed " << nb_tets_to_delete 
                    << " tets (free list and infinite)" << std::endl;
            }
        }

        delete W;

        set_arrays(
            nb_tets,
            cell_to_v_store_.data(),
            cell_to_cell_store_.data()
        );
    }